

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O2

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::NewNode
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key,int height)

{
  long lVar1;
  Node *pNVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pNVar2 = (Node *)Arena::AllocateAligned(this->arena_,(long)height * 8 + 8);
  pNVar2->key = *key;
  pNVar2->next_[0]._M_b._M_p = (__pointer_type)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pNVar2;
  }
  __stack_chk_fail();
}

Assistant:

typename SkipList<Key, Comparator>::Node* SkipList<Key, Comparator>::NewNode(
    const Key& key, int height) {
  char* const node_memory = arena_->AllocateAligned(
      sizeof(Node) + sizeof(std::atomic<Node*>) * (height - 1));
  return new (node_memory) Node(key);
}